

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pp_elif(CTcTokenizer *this)

{
  int iVar1;
  int iVar2;
  tok_if_t tVar3;
  CTcTokenizer *in_RDI;
  CTcConstVal val;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  tc_constval_type_t in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  CTcConstVal::CTcConstVal((CTcConstVal *)&stack0xffffffffffffffd0);
  iVar1 = expand_macros_curline
                    ((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                     (int)((ulong)in_RDI >> 0x20));
  if (iVar1 == 0) {
    start_new_line((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (CTcTokString *)in_RDI,in_stack_ffffffffffffffc4);
    iVar1 = pp_parse_expr((CTcTokenizer *)in_stack_ffffffffffffffe8,
                          (CTcConstVal *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                          in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    if (iVar1 == 0) {
      iVar1 = in_RDI->if_sp_;
      iVar2 = CTcTokStream::get_init_if_level(in_RDI->str_);
      if (iVar2 < iVar1) {
        tVar3 = get_if_state(in_RDI);
        switch(tVar3) {
        case TOKIF_NONE:
        case TOKIF_ELSE_YES:
        case TOKIF_ELSE_NO:
          log_error(0x2724);
          break;
        case TOKIF_IF_YES:
          change_if_state(in_RDI,TOKIF_IF_DONE);
          break;
        case TOKIF_IF_NO:
          iVar2 = CTcConstVal::get_val_bool
                            ((CTcConstVal *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
          if (iVar2 != 0) {
            change_if_state(in_RDI,TOKIF_IF_YES);
          }
          break;
        case TOKIF_IF_DONE:
        }
        clear_linebuf((CTcTokenizer *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
      }
      else {
        log_error(0x273f);
        clear_linebuf((CTcTokenizer *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
      }
    }
    else {
      clear_linebuf((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
  }
  else {
    clear_linebuf((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

void CTcTokenizer::pp_elif()
{
    CTcConstVal val;

    /* expand macros; don't allow reading additional lines */
    if (expand_macros_curline(FALSE, TRUE, FALSE))
    {
        clear_linebuf();
        return;
    }

    /* parse out of the expansion buffer */
    start_new_line(&expbuf_, 0);

    /* parse the preprocessor expression */
    if (pp_parse_expr(&val, TRUE, TRUE, TRUE))
    {
        clear_linebuf();
        return;
    }

    /* 
     *   make sure that the #elif occurs in the same file as the
     *   corresponding #if 
     */
    if (if_sp_ <= str_->get_init_if_level())
    {
        /* log the error */
        log_error(TCERR_PP_ELIF_NOT_IN_SAME_FILE);
        
        /* clear the text and abort */
        clear_linebuf();
        return;
    }

    /* check the current #if state */
    switch(get_if_state())
    {
    case TOKIF_IF_YES:
        /* 
         *   we just took the #if branch, so don't take this or any
         *   subsequent #elif or #else branch, regardless of the value of
         *   the condition - set the state to DONE to indicate that we're
         *   skipping everything through the endif 
         */
        change_if_state(TOKIF_IF_DONE);
        break;
        
    case TOKIF_IF_NO:
        /*
         *   We haven't yet taken a #if or #elif branch, so we can take
         *   this branch if its condition is true.  If this branch's
         *   condition is false, stay with NO so that we will consider
         *   future #elif and #else branches. 
         */
        if (val.get_val_bool())
            change_if_state(TOKIF_IF_YES);
        break;
        
    case TOKIF_IF_DONE:
        /* 
         *   we've already taken a #if or #elif branch, so we must ignore
         *   this and subsequent #elif and #else branches until we get to
         *   our #endif - just stay in state DONE 
         */
        break;

    case TOKIF_NONE:
    case TOKIF_ELSE_YES:
    case TOKIF_ELSE_NO:
        /* 
         *   we're not in a #if branch at all, or we're inside a #else; a
         *   #elif is not legal here 
         */
        log_error(TCERR_PP_ELIF_WITHOUT_IF);
        break;
    }

    /* don't retain the directive in the preprocessed source */
    clear_linebuf();
}